

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Nonnull<char_*> __thiscall absl::lts_20250127::Cord::InlineRep::set_data(InlineRep *this,size_t n)

{
  if (n < 0x10) {
    (this->data_).rep_.field_0.as_tree.cordz_info = 0;
    (this->data_).rep_.field_0.as_tree.rep = (CordRep *)0x0;
    cord_internal::InlineData::Rep::set_inline_size((Rep *)this,n);
    return (Nonnull<char_*>)((long)&(this->data_).rep_.field_0 + 1);
  }
  __assert_fail("n <= kMaxInline",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0xb1,"absl::Nonnull<char *> absl::Cord::InlineRep::set_data(size_t)");
}

Assistant:

inline absl::Nonnull<char*> Cord::InlineRep::set_data(size_t n) {
  assert(n <= kMaxInline);
  ResetToEmpty();
  set_inline_size(n);
  return data_.as_chars();
}